

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::BitsToFloatCase::BitsToFloatCase
          (BitsToFloatCase *this,Context *context,DataType baseType,ShaderType shaderType)

{
  int vecSize;
  DataType basicType;
  char *description;
  ShaderType in_R8D;
  allocator<char> local_99;
  VarType local_98;
  string local_80;
  Symbol local_60;
  
  getCommonFuncCaseName_abi_cxx11_
            (&local_60.name,(Functional *)(ulong)baseType,TYPE_FLOAT_VEC2,shaderType,in_R8D);
  description = "uintBitsToFloat";
  if (baseType - TYPE_INT < 4) {
    description = "intBitsToFloat";
  }
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,context,local_60.name._M_dataplus._M_p,description,
             shaderType);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_01e540b0;
  vecSize = glu::getDataTypeScalarSize(baseType);
  if (vecSize < 2) {
    basicType = TYPE_FLOAT;
  }
  else {
    basicType = glu::getDataTypeFloatVec(vecSize);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"in0",&local_99);
  glu::VarType::VarType(&local_98,baseType,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_60,&local_80,&local_98);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_60);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_60);
  glu::VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out0",&local_99);
  glu::VarType::VarType(&local_98,basicType,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_60,&local_80,&local_98);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_60);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_60);
  glu::VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::assign((char *)&(this->super_CommonFunctionCase).m_spec.source);
  return;
}

Assistant:

BitsToFloatCase (Context& context, glu::DataType baseType, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, glu::PRECISION_HIGHP, shaderType).c_str(), glu::isDataTypeIntOrIVec(baseType) ? "intBitsToFloat" : "uintBitsToFloat", shaderType)
	{
		const bool			inIsSigned	= glu::isDataTypeIntOrIVec(baseType);
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	floatType	= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(floatType, glu::PRECISION_HIGHP)));
		m_spec.source = inIsSigned ? "out0 = intBitsToFloat(in0);" : "out0 = uintBitsToFloat(in0);";
	}